

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

Vec_Int_t * Llb_Nonlin4CreateOrder(Aig_Man_t *pAig)

{
  Vec_Ptr_t *p;
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  int local_80;
  int local_30;
  int local_2c;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vOrder;
  Vec_Int_t *vNodes;
  Aig_Man_t *pAig_local;
  
  vOrder = (Vec_Int_t *)0x0;
  local_30 = 0;
  vNodes = (Vec_Int_t *)pAig;
  iVar2 = Aig_ManObjNumMax(pAig);
  pObj = (Aig_Obj_t *)Vec_IntStartFull(iVar2);
  Aig_ManIncrementTravId((Aig_Man_t *)vNodes);
  pVVar1 = vNodes;
  pAVar5 = Aig_ManConst1((Aig_Man_t *)vNodes);
  Aig_ObjSetTravIdCurrent((Aig_Man_t *)pVVar1,pAVar5);
  for (local_2c = 0; iVar2 = local_2c, iVar3 = Saig_ManRegNum((Aig_Man_t *)vNodes), iVar4 = local_2c
      , iVar2 < iVar3; local_2c = local_2c + 1) {
    p = (Vec_Ptr_t *)vNodes[1].pArray;
    iVar2 = Saig_ManPoNum((Aig_Man_t *)vNodes);
    _Counter = (Aig_Obj_t *)Vec_PtrEntry(p,iVar4 + iVar2);
    pAVar5 = pObj;
    iVar4 = Aig_ObjId(_Counter);
    iVar2 = local_30;
    local_30 = local_30 + 1;
    Vec_IntWriteEntry((Vec_Int_t *)pAVar5,iVar4,iVar2);
    pVVar1 = vNodes;
    pAVar5 = Aig_ObjFanin0(_Counter);
    Llb_Nonlin4CreateOrder_rec((Aig_Man_t *)pVVar1,pAVar5,(Vec_Int_t *)pObj,&local_30);
  }
  for (local_2c = 0; iVar4 = local_2c, iVar3 = Vec_PtrSize(*(Vec_Ptr_t **)(vNodes + 1)),
      iVar2 = local_30, iVar4 < iVar3; local_2c = local_2c + 1) {
    _Counter = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(vNodes + 1),local_2c);
    iVar2 = Llb_ObjBddVar((Vec_Int_t *)pObj,_Counter);
    pAVar5 = pObj;
    if (iVar2 < 0) {
      iVar4 = Aig_ObjId(_Counter);
      iVar2 = local_30;
      local_30 = local_30 + 1;
      Vec_IntWriteEntry((Vec_Int_t *)pAVar5,iVar4,iVar2);
    }
  }
  iVar4 = Aig_ManCiNum((Aig_Man_t *)vNodes);
  iVar3 = Aig_ManRegNum((Aig_Man_t *)vNodes);
  if (vOrder == (Vec_Int_t *)0x0) {
    local_80 = 0;
  }
  else {
    local_80 = Vec_IntSize(vOrder);
  }
  if (iVar4 + iVar3 + local_80 < iVar2) {
    __assert_fail("Counter <= Aig_ManCiNum(pAig) + Aig_ManRegNum(pAig) + (vNodes?Vec_IntSize(vNodes):0)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb4Nonlin.c"
                  ,0x178,"Vec_Int_t *Llb_Nonlin4CreateOrder(Aig_Man_t *)");
  }
  Aig_ManCleanMarkA((Aig_Man_t *)vNodes);
  Vec_IntFreeP(&vOrder);
  return (Vec_Int_t *)pObj;
}

Assistant:

Vec_Int_t * Llb_Nonlin4CreateOrder( Aig_Man_t * pAig )
{
    Vec_Int_t * vNodes = NULL;
    Vec_Int_t * vOrder;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
/*
    // mark internal nodes to be used
    Aig_ManCleanMarkA( pAig );
    vNodes = Llb_Nonlin4CollectHighRefNodes( pAig, 4 );
    Aig_ManForEachObjVec( vNodes, pAig, pObj, i )
        pObj->fMarkA = 1;
printf( "Techmapping added %d pivots.\n", Vec_IntSize(vNodes) );
*/
    // collect nodes in the order
    vOrder = Vec_IntStartFull( Aig_ManObjNumMax(pAig) );
    Aig_ManIncrementTravId( pAig );
    Aig_ObjSetTravIdCurrent( pAig, Aig_ManConst1(pAig) );
    Saig_ManForEachLi( pAig, pObj, i )
    {
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
        Llb_Nonlin4CreateOrder_rec( pAig, Aig_ObjFanin0(pObj), vOrder, &Counter );
    }
    Aig_ManForEachCi( pAig, pObj, i )
        if ( Llb_ObjBddVar(vOrder, pObj) < 0 )
        {
//            if ( Saig_ObjIsLo(pAig, pObj) )
//                Vec_IntWriteEntry( vOrder, Aig_ObjId(Saig_ObjLoToLi(pAig, pObj)), Counter++ );
            Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
        }
    assert( Counter <= Aig_ManCiNum(pAig) + Aig_ManRegNum(pAig) + (vNodes?Vec_IntSize(vNodes):0) );
    Aig_ManCleanMarkA( pAig );
    Vec_IntFreeP( &vNodes );
    return vOrder;
}